

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::TryFindExtensionInFallbackDatabase
          (DescriptorPool *this,Descriptor *containing_type,int field_number)

{
  long *plVar1;
  byte bVar2;
  string *psVar3;
  pointer key;
  Tables *this_00;
  FileDescriptor *pFVar4;
  undefined4 in_EDX;
  Descriptor *in_RSI;
  long in_RDI;
  FileDescriptorProto *in_stack_00000010;
  DescriptorPool *in_stack_00000018;
  FileDescriptorProto file_proto;
  FileDescriptorProto *in_stack_fffffffffffffec0;
  undefined1 local_f8 [8];
  FileDescriptorProto *in_stack_ffffffffffffff10;
  bool local_1;
  
  if (*(long *)(in_RDI + 8) == 0) {
    local_1 = false;
  }
  else {
    FileDescriptorProto::FileDescriptorProto(in_stack_ffffffffffffff10);
    plVar1 = *(long **)(in_RDI + 8);
    psVar3 = Descriptor::full_name_abi_cxx11_(in_RSI);
    bVar2 = (**(code **)(*plVar1 + 0x20))(plVar1,psVar3,in_EDX,local_f8);
    if ((bVar2 & 1) == 0) {
      local_1 = false;
    }
    else {
      key = std::
            unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
            ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                          *)0x4aec5a);
      this_00 = (Tables *)FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)0x4aec69);
      in_stack_fffffffffffffec0 = (FileDescriptorProto *)Tables::FindFile(this_00,(string *)key);
      if (in_stack_fffffffffffffec0 == (FileDescriptorProto *)0x0) {
        pFVar4 = BuildFileFromDatabase(in_stack_00000018,in_stack_00000010);
        if (pFVar4 == (FileDescriptor *)0x0) {
          local_1 = false;
        }
        else {
          local_1 = true;
        }
      }
      else {
        local_1 = false;
      }
    }
    FileDescriptorProto::~FileDescriptorProto(in_stack_fffffffffffffec0);
  }
  return local_1;
}

Assistant:

bool DescriptorPool::TryFindExtensionInFallbackDatabase(
    const Descriptor* containing_type, int field_number) const {
  if (fallback_database_ == nullptr) return false;

  FileDescriptorProto file_proto;
  if (!fallback_database_->FindFileContainingExtension(
          containing_type->full_name(), field_number, &file_proto)) {
    return false;
  }

  if (tables_->FindFile(file_proto.name()) != nullptr) {
    // We've already loaded this file, and it apparently doesn't contain the
    // extension we're looking for.  Some DescriptorDatabases return false
    // positives.
    return false;
  }

  if (BuildFileFromDatabase(file_proto) == nullptr) {
    return false;
  }

  return true;
}